

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O0

void __thiscall xe::xml::Parser::advance(Parser *this)

{
  bool bVar1;
  char *name;
  mapped_type *dst;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Token local_14;
  Parser *pPStack_10;
  Token curToken;
  Parser *this_local;
  
  pPStack_10 = this;
  if (this->m_element == ELEMENT_START) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear(&this->m_attributes);
  }
  if (this->m_state == STATE_YIELD_EMPTY_ELEMENT_END) {
    this->m_element = ELEMENT_END;
    this->m_state = STATE_DATA;
    return;
  }
  if (this->m_element != ELEMENT_INCOMPLETE) {
    Tokenizer::advance(&this->m_tokenizer);
    this->m_element = ELEMENT_INCOMPLETE;
  }
  do {
    local_14 = Tokenizer::getToken(&this->m_tokenizer);
    while (local_14 == TOKEN_COMMENT) {
      Tokenizer::advance(&this->m_tokenizer);
      local_14 = Tokenizer::getToken(&this->m_tokenizer);
    }
    if (local_14 == TOKEN_INCOMPLETE) {
      return;
    }
    switch(this->m_state) {
    case STATE_ENTITY:
      this->m_state = STATE_DATA;
    case STATE_DATA:
      switch(local_14) {
      case TOKEN_END_OF_STRING:
        this->m_element = ELEMENT_END_OF_STRING;
        return;
      case TOKEN_DATA:
        this->m_element = ELEMENT_DATA;
        return;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_38,"Unexpected token",&local_39);
        error(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
        break;
      case TOKEN_TAG_START:
        this->m_state = STATE_START_TAG_OPEN;
        break;
      case TOKEN_END_TAG_START:
        this->m_state = STATE_END_TAG_OPEN;
        break;
      case TOKEN_PROCESSING_INSTRUCTION_START:
        this->m_state = STATE_IN_PROCESSING_INSTRUCTION;
        break;
      case TOKEN_ENTITY:
        this->m_state = STATE_ENTITY;
        this->m_element = ELEMENT_DATA;
        parseEntityValue(this);
        return;
      }
      break;
    case STATE_IN_PROCESSING_INSTRUCTION:
      if (local_14 == TOKEN_PROCESSING_INSTRUCTION_END) {
        this->m_state = STATE_DATA;
      }
      else if (((local_14 != TOKEN_IDENTIFIER) && (local_14 != TOKEN_EQUAL)) &&
              (local_14 != TOKEN_STRING)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"Unexpected token in processing instruction",&local_71);
        error(this,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::allocator<char>::~allocator(&local_71);
      }
      break;
    case STATE_START_TAG_OPEN:
      if (local_14 != TOKEN_IDENTIFIER) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"Expected identifier",&local_99);
        error(this,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator(&local_99);
      }
      Tokenizer::getTokenStr(&this->m_tokenizer,&this->m_elementName);
      this->m_state = STATE_ATTRIBUTE_LIST;
      break;
    case STATE_END_TAG_OPEN:
      if (local_14 != TOKEN_IDENTIFIER) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,"Expected identifier",&local_c1);
        error(this,&local_c0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator(&local_c1);
      }
      Tokenizer::getTokenStr(&this->m_tokenizer,&this->m_elementName);
      this->m_state = STATE_EXPECTING_END_TAG_CLOSE;
      break;
    case STATE_EXPECTING_END_TAG_CLOSE:
      if (local_14 != TOKEN_TAG_END) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e8,"Expected tag end",&local_e9);
        error(this,&local_e8);
        std::__cxx11::string::~string((string *)&local_e8);
        std::allocator<char>::~allocator(&local_e9);
      }
      this->m_state = STATE_DATA;
      this->m_element = ELEMENT_END;
      return;
    case STATE_ATTRIBUTE_LIST:
      if (local_14 == TOKEN_IDENTIFIER) {
        Tokenizer::getTokenStr(&this->m_tokenizer,&this->m_attribName);
        this->m_state = STATE_EXPECTING_ATTRIBUTE_EQ;
      }
      else {
        if (local_14 == TOKEN_EMPTY_ELEMENT_END) {
          this->m_state = STATE_YIELD_EMPTY_ELEMENT_END;
          this->m_element = ELEMENT_START;
          return;
        }
        if (local_14 == TOKEN_TAG_END) {
          this->m_state = STATE_DATA;
          this->m_element = ELEMENT_START;
          return;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"Unexpected token",&local_111);
        error(this,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
      }
      break;
    case STATE_EXPECTING_ATTRIBUTE_EQ:
      if (local_14 != TOKEN_EQUAL) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,"Expected \'=\'",&local_139);
        error(this,&local_138);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
      }
      this->m_state = STATE_EXPECTING_ATTRIBUTE_VALUE;
      break;
    case STATE_EXPECTING_ATTRIBUTE_VALUE:
      if (local_14 != TOKEN_STRING) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"Expected value",&local_161);
        error(this,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator(&local_161);
      }
      name = (char *)std::__cxx11::string::c_str();
      bVar1 = hasAttribute(this,name);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"Duplicate attribute",&local_189);
        error(this,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::allocator<char>::~allocator(&local_189);
      }
      dst = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->m_attributes,&this->m_attribName);
      Tokenizer::getString(&this->m_tokenizer,dst);
      this->m_state = STATE_ATTRIBUTE_LIST;
    }
    Tokenizer::advance(&this->m_tokenizer);
  } while( true );
}

Assistant:

void Parser::advance (void)
{
	if (m_element == ELEMENT_START)
		m_attributes.clear();

	// \note No token is advanced when element end is reported.
	if (m_state == STATE_YIELD_EMPTY_ELEMENT_END)
	{
		DE_ASSERT(m_element == ELEMENT_START);
		m_element	= ELEMENT_END;
		m_state		= STATE_DATA;
		return;
	}

	if (m_element != ELEMENT_INCOMPLETE)
	{
		m_tokenizer.advance();
		m_element = ELEMENT_INCOMPLETE;
	}

	for (;;)
	{
		Token curToken = m_tokenizer.getToken();

		// Skip comments.
		while (curToken == TOKEN_COMMENT)
		{
			m_tokenizer.advance();
			curToken = m_tokenizer.getToken();
		}

		if (curToken == TOKEN_INCOMPLETE)
		{
			DE_ASSERT(m_element == ELEMENT_INCOMPLETE);
			return;
		}

		switch (m_state)
		{
			case STATE_ENTITY:
				m_state = STATE_DATA;
				// Fall-through to STATE_DATA processing.

			case STATE_DATA:
				switch (curToken)
				{
					case TOKEN_DATA:
						m_element = ELEMENT_DATA;
						return;

					case TOKEN_END_OF_STRING:
						m_element = ELEMENT_END_OF_STRING;
						return;

					case TOKEN_TAG_START:
						m_state = STATE_START_TAG_OPEN;
						break;

					case TOKEN_END_TAG_START:
						m_state = STATE_END_TAG_OPEN;
						break;

					case TOKEN_PROCESSING_INSTRUCTION_START:
						m_state = STATE_IN_PROCESSING_INSTRUCTION;
						break;

					case TOKEN_ENTITY:
						m_state		= STATE_ENTITY;
						m_element	= ELEMENT_DATA;
						parseEntityValue();
						return;

					default:
						error("Unexpected token");
				}
				break;

			case STATE_IN_PROCESSING_INSTRUCTION:
				if (curToken == TOKEN_PROCESSING_INSTRUCTION_END)
					m_state = STATE_DATA;
				else
					if (curToken != TOKEN_IDENTIFIER && curToken != TOKEN_EQUAL && curToken != TOKEN_STRING)
						error("Unexpected token in processing instruction");
				break;

			case STATE_START_TAG_OPEN:
				if (curToken != TOKEN_IDENTIFIER)
					error("Expected identifier");
				m_tokenizer.getTokenStr(m_elementName);
				m_state = STATE_ATTRIBUTE_LIST;
				break;

			case STATE_END_TAG_OPEN:
				if (curToken != TOKEN_IDENTIFIER)
					error("Expected identifier");
				m_tokenizer.getTokenStr(m_elementName);
				m_state = STATE_EXPECTING_END_TAG_CLOSE;
				break;

			case STATE_EXPECTING_END_TAG_CLOSE:
				if (curToken != TOKEN_TAG_END)
					error("Expected tag end");
				m_state		= STATE_DATA;
				m_element	= ELEMENT_END;
				return;

			case STATE_ATTRIBUTE_LIST:
				if (curToken == TOKEN_IDENTIFIER)
				{
					m_tokenizer.getTokenStr(m_attribName);
					m_state = STATE_EXPECTING_ATTRIBUTE_EQ;
				}
				else if (curToken == TOKEN_EMPTY_ELEMENT_END)
				{
					m_state		= STATE_YIELD_EMPTY_ELEMENT_END;
					m_element	= ELEMENT_START;
					return;
				}
				else if (curToken == TOKEN_TAG_END)
				{
					m_state		= STATE_DATA;
					m_element	= ELEMENT_START;
					return;
				}
				else
					error("Unexpected token");
				break;

			case STATE_EXPECTING_ATTRIBUTE_EQ:
				if (curToken != TOKEN_EQUAL)
					error("Expected '='");
				m_state = STATE_EXPECTING_ATTRIBUTE_VALUE;
				break;

			case STATE_EXPECTING_ATTRIBUTE_VALUE:
				if (curToken != TOKEN_STRING)
					error("Expected value");
				if (hasAttribute(m_attribName.c_str()))
					error("Duplicate attribute");

				m_tokenizer.getString(m_attributes[m_attribName]);
				m_state = STATE_ATTRIBUTE_LIST;
				break;

			default:
				DE_ASSERT(false);
		}

		m_tokenizer.advance();
	}
}